

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O1

lws_usec_t lws_sul_nonmonotonic_adjust(lws_context *ctx,int64_t step_us)

{
  ushort uVar1;
  uint uVar2;
  lws_context_per_thread *plVar3;
  long lVar4;
  lws_sorted_usec_list_t *sul;
  lws_dll2 *plVar5;
  bool bVar6;
  
  uVar1 = ctx->count_threads;
  if (uVar1 != 0) {
    plVar3 = ctx->pt;
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        if (plVar3->pt_sul_owner[lVar4].count != 0) {
          plVar5 = (lws_dll2 *)(plVar3->pt_sul_owner + lVar4);
          while (plVar5 = plVar5->next, plVar5 != (lws_dll2 *)0x0) {
            plVar5[1].prev = (lws_dll2 *)((long)&(plVar5[1].prev)->prev + step_us);
          }
        }
        bVar6 = lVar4 == 0;
        lVar4 = lVar4 + 1;
      } while (bVar6);
      plVar3 = plVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar2 != uVar1);
  }
  return 0;
}

Assistant:

lws_usec_t
lws_sul_nonmonotonic_adjust(struct lws_context *ctx, int64_t step_us)
{
	struct lws_context_per_thread *pt = &ctx->pt[0];
	int n, m;

	/*
	 * for each pt
	 */

	for (m = 0; m < ctx->count_threads; m++) {

		/*
		 * For each owning list...
		 */

		lws_pt_lock(pt, __func__);

		for (n = 0; n < LWS_COUNT_PT_SUL_OWNERS; n++) {

			if (!pt->pt_sul_owner[n].count)
				continue;

			/* ... and for every existing sul on a list... */

			lws_start_foreach_dll(struct lws_dll2 *, p,
					      lws_dll2_get_head(
							&pt->pt_sul_owner[n])) {
				lws_sorted_usec_list_t *sul = lws_container_of(
					       p, lws_sorted_usec_list_t, list);

				/*
				 * ... retrospectively step its ripe time by the
				 * step we will adjust the gettimeofday() clock
				 * with
				 */

				sul->us += step_us;

			} lws_end_foreach_dll(p);
		}

		lws_pt_unlock(pt);

		pt++;
	}

	return 0;
}